

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O0

void InitUnigramTable(void)

{
  double dVar1;
  double power;
  double d1;
  double train_words_pow;
  int i;
  int a;
  
  d1 = 0.0;
  table = (int *)malloc(400000000);
  if (table == (int *)0x0) {
    fprintf(_stderr,"cannot allocate memory for the table\n");
    exit(1);
  }
  for (train_words_pow._4_4_ = 0; train_words_pow._4_4_ < vocab_size;
      train_words_pow._4_4_ = train_words_pow._4_4_ + 1) {
    dVar1 = pow((double)vocab[train_words_pow._4_4_].cn,0.75);
    d1 = dVar1 + d1;
  }
  train_words_pow._0_4_ = 0;
  dVar1 = pow((double)vocab->cn,0.75);
  power = dVar1 / d1;
  for (train_words_pow._4_4_ = 0; train_words_pow._4_4_ < 100000000;
      train_words_pow._4_4_ = train_words_pow._4_4_ + 1) {
    table[train_words_pow._4_4_] = train_words_pow._0_4_;
    if (power < (double)train_words_pow._4_4_ / 100000000.0) {
      train_words_pow._0_4_ = train_words_pow._0_4_ + 1;
      dVar1 = pow((double)vocab[train_words_pow._0_4_].cn,0.75);
      power = dVar1 / d1 + power;
    }
    if (vocab_size <= train_words_pow._0_4_) {
      train_words_pow._0_4_ = (int)vocab_size + -1;
    }
  }
  return;
}

Assistant:

void InitUnigramTable() {
  int a, i;
  double train_words_pow = 0;
  double d1, power = 0.75;
  table = (int *)malloc(table_size * sizeof(int));
  if (table == NULL) {
    fprintf(stderr, "cannot allocate memory for the table\n");
    exit(1);
  }
  for (a = 0; a < vocab_size; a++) train_words_pow += pow(vocab[a].cn, power);
  i = 0;
  d1 = pow(vocab[i].cn, power) / train_words_pow;
  for (a = 0; a < table_size; a++) {
    table[a] = i;
    if (a / (double)table_size > d1) {
      i++;
      d1 += pow(vocab[i].cn, power) / train_words_pow;
    }
    if (i >= vocab_size) i = vocab_size - 1;
  }
}